

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O1

uint aom_highbd_12_variance32x8_c(uint8_t *a,int a_stride,uint8_t *b,int b_stride,uint32_t *sse)

{
  long lVar1;
  long lVar2;
  int j;
  long lVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  lVar2 = (long)b * 2;
  lVar4 = (long)a * 2;
  iVar7 = 0;
  lVar6 = 0;
  lVar1 = 0;
  do {
    lVar3 = 0;
    iVar8 = 0;
    do {
      iVar9 = (uint)*(ushort *)(lVar4 + lVar3 * 2) - (uint)*(ushort *)(lVar2 + lVar3 * 2);
      iVar8 = iVar8 + iVar9;
      lVar6 = lVar6 + (ulong)(uint)(iVar9 * iVar9);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x20);
    lVar1 = lVar1 + iVar8;
    iVar7 = iVar7 + 1;
    lVar2 = lVar2 + (long)b_stride * 2;
    lVar4 = lVar4 + (long)a_stride * 2;
  } while (iVar7 != 8);
  uVar5 = (uint)((ulong)(lVar6 + 0x80) >> 8);
  *sse = uVar5;
  lVar2 = lVar1 * 0x10000000 + 0x80000000 >> 0x20;
  lVar2 = (ulong)uVar5 - ((ulong)(lVar2 * lVar2) >> 8);
  uVar5 = (uint)lVar2;
  if (lVar2 < 0) {
    uVar5 = 0;
  }
  return uVar5;
}

Assistant:

static void highbd_variance64(const uint8_t *a8, int a_stride,
                              const uint8_t *b8, int b_stride, int w, int h,
                              uint64_t *sse, int64_t *sum) {
  const uint16_t *a = CONVERT_TO_SHORTPTR(a8);
  const uint16_t *b = CONVERT_TO_SHORTPTR(b8);
  int64_t tsum = 0;
  uint64_t tsse = 0;
  for (int i = 0; i < h; ++i) {
    int32_t lsum = 0;
    for (int j = 0; j < w; ++j) {
      const int diff = a[j] - b[j];
      lsum += diff;
      tsse += (uint32_t)(diff * diff);
    }
    tsum += lsum;
    a += a_stride;
    b += b_stride;
  }
  *sum = tsum;
  *sse = tsse;
}